

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo.cpp
# Opt level: O3

void another_clib_func(_func_void_void_ptr_int *callback,void *user)

{
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[another] before",0x10);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
  std::ostream::put('X');
  std::ostream::flush();
  (*callback)(user,0xe9);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[another] after",0xf);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
  std::ostream::put('X');
  std::ostream::flush();
  return;
}

Assistant:

void another_clib_func(void (*callback)(void *user, int input), void *user) {
  std::cout << "[another] before" << std::endl;
  callback(user, 233);
  std::cout << "[another] after" << std::endl;
}